

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

bool __thiscall
cmCommonTargetGenerator::HaveRequiredLanguages
          (cmCommonTargetGenerator *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *sources,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languagesNeeded)

{
  pointer ppcVar1;
  cmMakefile *this_00;
  bool bVar2;
  cmState *this_01;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  pointer ppcVar5;
  string sStack_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  ppcVar1 = (sources->
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>)._M_impl
            .super__Vector_impl_data._M_finish;
  for (ppcVar5 = (sources->
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar1; ppcVar5 = ppcVar5 + 1
      ) {
    cmSourceFile::GetLanguage_abi_cxx11_((string *)&local_88,*ppcVar5);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)languagesNeeded,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  this_00 = this->Makefile;
  this_01 = cmMakefile::GetState(this_00);
  p_Var3 = (languagesNeeded->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(languagesNeeded->_M_t)._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)p_Var3 == p_Var4) {
LAB_00321f62:
      return (_Rb_tree_header *)p_Var3 == p_Var4;
    }
    bVar2 = cmState::GetLanguageEnabled(this_01,(string *)(p_Var3 + 1));
    if (!bVar2) {
      local_88.View_._M_len = 0xd;
      local_88.View_._M_str = "The language ";
      local_58.View_._M_str = *(char **)(p_Var3 + 1);
      local_58.View_._M_len = (size_t)p_Var3[1]._M_parent;
      cmStrCat<char[169]>(&sStack_a8,&local_88,&local_58,
                          (char (*) [169])
                          " was requested for compilation but was not enabled. To enable a language it needs to be specified in a \'project\' or \'enable_language\' command in the root CMakeLists.txt"
                         );
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&sStack_a8);
      std::__cxx11::string::~string((string *)&sStack_a8);
      goto LAB_00321f62;
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

bool cmCommonTargetGenerator::HaveRequiredLanguages(
  const std::vector<cmSourceFile const*>& sources,
  std::set<std::string>& languagesNeeded) const
{
  for (cmSourceFile const* sf : sources) {
    languagesNeeded.insert(sf->GetLanguage());
  }

  auto* makefile = this->Makefile;
  auto* state = makefile->GetState();
  auto unary = [&state, &makefile](const std::string& lang) -> bool {
    const bool valid = state->GetLanguageEnabled(lang);
    if (!valid) {
      makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("The language ", lang,
                 " was requested for compilation but was not enabled."
                 " To enable a language it needs to be specified in a"
                 " 'project' or 'enable_language' command in the root"
                 " CMakeLists.txt"));
    }
    return valid;
  };
  return std::all_of(languagesNeeded.cbegin(), languagesNeeded.cend(), unary);
}